

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O2

void llvm::yaml::MappingTraits<llvm::DWARFYAML::LineTableOpcode>::mapping
               (IO *IO,LineTableOpcode *LineTableOpcode)

{
  int iVar1;
  
  yaml::IO::mapRequired<llvm::dwarf::LineNumberOps>(IO,"Opcode",&LineTableOpcode->Opcode);
  if (LineTableOpcode->Opcode == DW_LNS_extended_op) {
    yaml::IO::mapRequired<unsigned_long>(IO,"ExtLen",&LineTableOpcode->ExtLen);
    yaml::IO::mapRequired<llvm::dwarf::LineNumberExtendedOps>
              (IO,"SubOpcode",&LineTableOpcode->SubOpcode);
  }
  if ((LineTableOpcode->UnknownOpcodeData).
      super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (LineTableOpcode->UnknownOpcodeData).
      super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00db1b52;
  }
  else {
LAB_00db1b52:
    yaml::IO::mapOptional<std::vector<llvm::yaml::Hex8,std::allocator<llvm::yaml::Hex8>>>
              (IO,"UnknownOpcodeData",&LineTableOpcode->UnknownOpcodeData);
  }
  if ((LineTableOpcode->UnknownOpcodeData).
      super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (LineTableOpcode->UnknownOpcodeData).
      super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00db1b7c;
  }
  else {
LAB_00db1b7c:
    yaml::IO::mapOptional<std::vector<llvm::yaml::Hex64,std::allocator<llvm::yaml::Hex64>>>
              (IO,"StandardOpcodeData",&LineTableOpcode->StandardOpcodeData);
  }
  if ((LineTableOpcode->FileEntry).Name.Length == 0) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 == '\0') goto LAB_00db1ba3;
  }
  else {
LAB_00db1ba3:
    yaml::IO::mapOptional<llvm::DWARFYAML::File>(IO,"FileEntry",&LineTableOpcode->FileEntry);
  }
  if (LineTableOpcode->Opcode != DW_LNS_advance_line) {
    iVar1 = (*IO->_vptr_IO[2])(IO);
    if ((char)iVar1 != '\0') goto LAB_00db1bdb;
  }
  yaml::IO::mapOptional<long>(IO,"SData",&LineTableOpcode->SData);
LAB_00db1bdb:
  yaml::IO::mapOptional<unsigned_long>(IO,"Data",&LineTableOpcode->Data);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::LineTableOpcode>::mapping(
    IO &IO, DWARFYAML::LineTableOpcode &LineTableOpcode) {
  IO.mapRequired("Opcode", LineTableOpcode.Opcode);
  if (LineTableOpcode.Opcode == dwarf::DW_LNS_extended_op) {
    IO.mapRequired("ExtLen", LineTableOpcode.ExtLen);
    IO.mapRequired("SubOpcode", LineTableOpcode.SubOpcode);
  }

  if (!LineTableOpcode.UnknownOpcodeData.empty() || !IO.outputting())
    IO.mapOptional("UnknownOpcodeData", LineTableOpcode.UnknownOpcodeData);
  if (!LineTableOpcode.UnknownOpcodeData.empty() || !IO.outputting())
    IO.mapOptional("StandardOpcodeData", LineTableOpcode.StandardOpcodeData);
  if (!LineTableOpcode.FileEntry.Name.empty() || !IO.outputting())
    IO.mapOptional("FileEntry", LineTableOpcode.FileEntry);
  if (LineTableOpcode.Opcode == dwarf::DW_LNS_advance_line || !IO.outputting())
    IO.mapOptional("SData", LineTableOpcode.SData);
  IO.mapOptional("Data", LineTableOpcode.Data);
}